

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O2

void rgbcx::prepare_bc1_single_color_table
               (bc1_match_entry *pTable,uint8_t *pExpand,int size,bc1_approx_mode mode)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  int hi;
  ulong uVar11;
  uint uVar12;
  bc1_match_entry *pbVar13;
  int iVar14;
  int iVar15;
  
  lVar10 = 0;
  uVar5 = 0;
  if (0 < size) {
    uVar5 = (ulong)(uint)size;
  }
  do {
    if (lVar10 == 0x100) {
      return;
    }
    pbVar13 = pTable + lVar10;
    iVar15 = 0x100;
    uVar6 = 0;
    for (uVar8 = 0; uVar8 != uVar5; uVar8 = uVar8 + 1) {
      bVar1 = pExpand[uVar8];
      uVar12 = (uint)bVar1;
      uVar7 = uVar6;
      for (uVar11 = 0; (uint)size != uVar11; uVar11 = uVar11 + 1) {
        bVar2 = pExpand[uVar11];
        iVar4 = (int)lVar10;
        if (size == 0x20) {
          if (mode == cBC1IdealRound4) {
LAB_00114a2f:
            iVar4 = (bVar1 + 1 + (uint)bVar2 * 2) / 3 - iVar4;
            iVar9 = -iVar4;
            if (0 < iVar4) {
              iVar9 = iVar4;
            }
            goto LAB_00114a72;
          }
          if (mode == cBC1AMD) {
LAB_00114a15:
            uVar3 = (uint)bVar2 * 0x2b + (uint)bVar1 * 0x15 + 0x20 >> 6;
          }
          else {
            if (mode != cBC1NVidia) goto LAB_00114a52;
            uVar3 = (uint)(uVar7 >> 3);
          }
LAB_00114a20:
          iVar4 = uVar3 - iVar4;
          iVar9 = -iVar4;
          if (0 < iVar4) {
            iVar9 = iVar4;
          }
        }
        else {
          if (mode == cBC1IdealRound4) goto LAB_00114a2f;
          if (mode == cBC1AMD) goto LAB_00114a15;
          if (mode == cBC1NVidia) {
            uVar3 = (int)((int)(uVar12 - bVar2) / 4 + (uint)bVar2 * 0x100 + (uVar12 - bVar2) * 0x50
                         + 0x80) / 0x100;
            goto LAB_00114a20;
          }
LAB_00114a52:
          iVar4 = (uVar12 + (uint)bVar2 * 2) / 3 - iVar4;
          iVar9 = -iVar4;
          if (0 < iVar4) {
            iVar9 = iVar4;
          }
          if (mode != cBC1Ideal) goto LAB_00114a8f;
LAB_00114a72:
          iVar14 = bVar2 - uVar12;
          iVar4 = -iVar14;
          if (0 < iVar14) {
            iVar4 = iVar14;
          }
          iVar9 = iVar9 + (uint)(iVar4 * 3) / 100;
        }
LAB_00114a8f:
        if ((iVar9 < iVar15) || ((uVar8 == uVar11 && (iVar9 == iVar15)))) {
          pbVar13->m_hi = (uint8_t)uVar11;
          pbVar13->m_lo = (uint8_t)uVar8;
          pbVar13->m_e = (uint8_t)iVar9;
          iVar15 = iVar9;
        }
        uVar7 = (ulong)((int)uVar7 + 0x2c);
      }
      uVar6 = (ulong)((int)uVar6 + 0x16);
    }
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

static void prepare_bc1_single_color_table(bc1_match_entry* pTable, const uint8_t* pExpand, int size, bc1_approx_mode mode)
	{
		for (int i = 0; i < 256; i++)
		{
			int lowest_e = 256;
			for (int lo = 0; lo < size; lo++)
			{
				const int lo_e = pExpand[lo];

				for (int hi = 0; hi < size; hi++)
				{
					const int hi_e = pExpand[hi];

					const int v = (size == 32) ? interp_5(hi, lo, hi_e, lo_e, mode) : interp_6(hi, lo, hi_e, lo_e, mode);
					
					int e = iabs(v - i);

					if ((mode == bc1_approx_mode::cBC1Ideal) || (mode == bc1_approx_mode::cBC1IdealRound4))
						e += (iabs(hi_e - lo_e) * 3) / 100;

					// Favor equal endpoints, for lower error on actual GPU's which approximate the interpolation.
					if ((e < lowest_e) || ((e == lowest_e) && (lo == hi)))
					{
						pTable[i].m_hi = static_cast<uint8_t>(hi);
						pTable[i].m_lo = static_cast<uint8_t>(lo);
						
						assert(e <= UINT8_MAX);
						pTable[i].m_e = static_cast<uint8_t>(e);

						lowest_e = e;
					}

				} // hi
			} // lo
		}
	}